

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.cpp
# Opt level: O0

void __thiscall YAML::Stream::AdvanceCurrent(Stream *this)

{
  bool bVar1;
  Stream *in_RDI;
  Stream *this_00;
  
  this_00 = in_RDI;
  bVar1 = std::deque<char,_std::allocator<char>_>::empty
                    ((deque<char,_std::allocator<char>_> *)0xf2a76c);
  if (!bVar1) {
    std::deque<char,_std::allocator<char>_>::pop_front((deque<char,_std::allocator<char>_> *)in_RDI)
    ;
    (in_RDI->m_mark).pos = (in_RDI->m_mark).pos + 1;
  }
  ReadAheadTo(this_00,(size_t)in_RDI);
  return;
}

Assistant:

void Stream::AdvanceCurrent() {
  if (!m_readahead.empty()) {
    m_readahead.pop_front();
    m_mark.pos++;
  }

  ReadAheadTo(0);
}